

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionSwapTest_LhsCleared_Test::TestBody
          (GeneratedMessageReflectionSwapTest_LhsCleared_Test *this)

{
  Reflection *reflection;
  undefined1 local_690 [8];
  TestAllTypes rhs;
  TestAllTypes lhs;
  GeneratedMessageReflectionSwapTest_LhsCleared_Test *this_local;
  
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)((long)&rhs.field_0 + 0x328));
  proto2_unittest::TestAllTypes::TestAllTypes((TestAllTypes *)local_690);
  TestUtil::SetAllFields<proto2_unittest::TestAllTypes>
            ((TestAllTypes *)((long)&rhs.field_0 + 0x328));
  proto2_unittest::TestAllTypes::Clear((TestAllTypes *)((long)&rhs.field_0 + 0x328));
  reflection = proto2_unittest::TestAllTypes::GetReflection();
  GeneratedMessageReflectionSwapTest::Swap
            (&this->super_GeneratedMessageReflectionSwapTest,reflection,
             (Message *)((long)&rhs.field_0 + 0x328),(Message *)local_690);
  TestUtil::ExpectClear<proto2_unittest::TestAllTypes>((TestAllTypes *)local_690);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)local_690);
  proto2_unittest::TestAllTypes::~TestAllTypes((TestAllTypes *)((long)&rhs.field_0 + 0x328));
  return;
}

Assistant:

TEST_P(GeneratedMessageReflectionSwapTest, LhsCleared) {
  unittest::TestAllTypes lhs;
  unittest::TestAllTypes rhs;

  TestUtil::SetAllFields(&lhs);

  // For proto2 message, for message field, Clear only reset hasbits, but
  // doesn't delete the underlying field.
  lhs.Clear();

  Swap(lhs.GetReflection(), &lhs, &rhs);

  TestUtil::ExpectClear(rhs);
}